

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerProfileLdSlot
          (Lowerer *this,Opnd *valueOpnd,Func *ldSlotFunc,ProfileId profileId,
          Instr *insertBeforeInstr)

{
  LowererMD *this_00;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  IntConstOpnd *opndArg;
  AddrOpnd *opndArg_00;
  Instr *instr;
  HelperCallOpnd *this_01;
  
  if (valueOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7d,"(valueOpnd)","valueOpnd");
    if (!bVar3) goto LAB_005bf52e;
    *puVar5 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7e,"(profileId != Js::Constants::NoProfileId)",
                       "profileId != Js::Constants::NoProfileId");
    if (!bVar3) goto LAB_005bf52e;
    *puVar5 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7f,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_005bf52e;
    *puVar5 = 0;
  }
  pFVar1 = insertBeforeInstr->m_func;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateProfileIdOpnd(profileId,pFVar1);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,&opndArg->super_Opnd);
  opndArg_00 = CreateFunctionBodyOpnd(this,ldSlotFunc);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,&opndArg_00->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,valueOpnd);
  instr = IR::Instr::New(Call,pFVar1);
  this_01 = IR::HelperCallOpnd::New(HelperProfileLdSlot,pFVar1);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005bf52e;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005bf52e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_01->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,instr);
  LowererMD::LowerCall(this_00,instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfileLdSlot(IR::Opnd *const valueOpnd, Func *const ldSlotFunc, const Js::ProfileId profileId, IR::Instr *const insertBeforeInstr)
{
    Assert(valueOpnd);
    Assert(profileId != Js::Constants::NoProfileId);
    Assert(insertBeforeInstr);

    Func *const irFunc = insertBeforeInstr->m_func;

    m_lowererMD.LoadHelperArgument(insertBeforeInstr, IR::Opnd::CreateProfileIdOpnd(profileId, irFunc));
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, CreateFunctionBodyOpnd(ldSlotFunc));
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, valueOpnd);

    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, irFunc);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfileLdSlot, irFunc));
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.LowerCall(callInstr, 0);
}